

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.c
# Opt level: O3

void text_screen_byte(ubyte iobyte,uint address)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  byte bVar4;
  
  uVar3 = address + 0x400;
  if (screen_start <= address) {
    uVar3 = address;
  }
  cVar1 = (char)((ushort)(uVar3 - screen_start) / 0x28);
  bVar2 = (char)(uVar3 - screen_start) + cVar1 * -0x28 + 1;
  bVar4 = cVar1 + 1;
  if (bVar4 == 0x19 && bVar2 == 0x28) {
    return;
  }
  gotoxy((ushort)bVar2,(ushort)bVar4);
  switch(iobyte) {
  case '[':
    iobyte = '\x1b';
    break;
  case ']':
    iobyte = '\x1a';
    break;
  case '^':
    iobyte = '\x18';
    break;
  case '_':
    iobyte = '#';
    break;
  default:
    switch(iobyte) {
    case '{':
    case '|':
    case '~':
    case '\x7f':
      break;
    case '}':
      goto switchD_0010bfa4_caseD_7d;
    default:
      if (iobyte != '#') goto switchD_0010bfa4_caseD_7d;
    }
  case '\\':
  case '`':
    iobyte = '?';
  }
switchD_0010bfa4_caseD_7d:
  putch(iobyte);
  update_cursor();
  return;
}

Assistant:

void text_screen_byte(ubyte iobyte, uint address) {
    ubyte column = 1;                          // init column (first column=1)
    ubyte row = 1;                             // init row    (first row=1)

    if (address < screen_start) address += 0x400;// deal with hardware wrap-around
    address -= screen_start;                   //

    column += address % 40;                      // calculate column
    row += address / 40;                         // calculate row
    if (column == 40 && row == 25)      // if bottom right, return since, any putchar
        return;                    // in this position will scroll the screen

    gotoxy(column, row);           // move pc cursor to correct position


    switch (iobyte) {                 // convert pc characters to teletext
        // characters
        case '_':
            iobyte = '#';
            break;
        case '[':
            iobyte = '\x1B';
            break; // some of these conversion are not
        case '\\':
            iobyte = '?';
            break; // stricly correct, since no corresponding
        case ']':
            iobyte = '\x1A';
            break; // character in the pc set exists
        case '^':
            iobyte = '\x18';
            break; //
        case '`':
            iobyte = '?';
            break; // notably the } characters is not
        case '#':
            iobyte = '?';
            break; // converted to the proper 3/4 symbol
        case '{':
            iobyte = '?';
            break;
        case '|':
            iobyte = '?';
            break;
        case '}':
            iobyte = '}';
            break;
        case '~':
            iobyte = '?';
            break;
        case 0x7F:
            iobyte = '?';
            break; // This conversion takes place because
            // 0x7F is used for the cursor when
            // copying
    }

    putch(iobyte);                            // Ouput the character

    update_cursor();                 // update to the correct position
    // as specified in the BBC hardware
}